

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall so_5::environment_t::run(environment_t *this)

{
  impl__run_stats_controller_and_go_further(this);
  return;
}

Assistant:

void
environment_t::run()
{
	try
	{
		impl__run_stats_controller_and_go_further();
	}
	catch( const so_5::exception_t & )
	{
		// Rethrow our exception because it already has all information.
		throw;
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
				rc_environment_error,
				std::string( "some unexpected error during "
						"environment launching: " ) + x.what() );
	}
}